

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_nlm.hpp
# Opt level: O2

void __thiscall
poplar::plain_bonsai_nlm<int>::
expand<poplar::plain_bonsai_trie<90u,poplar::hash::vigna_hasher>::node_map>
          (plain_bonsai_nlm<int> *this,node_map *pos_map)

{
  pointer puVar1;
  uint64_t uVar2;
  long lVar3;
  uint64_t i;
  ulong i_00;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  new_ptrs;
  allocator_type local_41;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  local_40;
  
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::vector(&local_40,
           (long)(this->ptrs_).
                 super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->ptrs_).
                 super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2,&local_41);
  lVar3 = 0;
  for (i_00 = 0; i_00 < (pos_map->map_).size_; i_00 = i_00 + 1) {
    uVar2 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::operator[](pos_map,i_00);
    if (uVar2 != 0xffffffffffffffff) {
      puVar1 = (this->ptrs_).
               super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::operator[](pos_map,i_00)
      ;
      std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::operator=
                ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
                 (local_40.
                  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar2),
                 (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
                 ((long)&(puVar1->_M_t).
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                 + lVar3));
    }
    lVar3 = lVar3 + 8;
  }
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::_M_move_assign(&this->ptrs_,&local_40);
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

void expand(const T& pos_map) {
        std::vector<std::unique_ptr<uint8_t[]>> new_ptrs(ptrs_.size() * 2);
        for (uint64_t i = 0; i < pos_map.size(); ++i) {
            if (pos_map[i] != UINT64_MAX) {
                new_ptrs[pos_map[i]] = std::move(ptrs_[i]);
            }
        }
        ptrs_ = std::move(new_ptrs);
    }